

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkRemovePo(Abc_Ntk_t *pNtk,int iOutput,int fRemoveConst0)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  
  pObj = Abc_NtkPo(pNtk,iOutput);
  pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
  pAVar2 = Abc_AigConst1(pNtk);
  if ((pAVar1 == pAVar2) && ((*(uint *)&pObj->field_0x14 >> 10 & 1) == fRemoveConst0)) {
    Abc_NtkDeleteObj(pObj);
    return;
  }
  return;
}

Assistant:

void Abc_NtkRemovePo( Abc_Ntk_t * pNtk, int iOutput, int fRemoveConst0 )
{
    Abc_Obj_t * pObj = Abc_NtkPo(pNtk, iOutput);
    if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pNtk) && Abc_ObjFaninC0(pObj) == fRemoveConst0 )
        Abc_NtkDeleteObj( pObj );
}